

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O0

void __thiscall
RecoveryTest_RaiseExceptionTest_Test::TestBody(RecoveryTest_RaiseExceptionTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> local_e0;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *local_c8;
  DeathTest *gtest_dt;
  RE *local_30;
  RE *gtest_regex;
  char regex [19];
  RecoveryTest_RaiseExceptionTest_Test *this_local;
  
  gtest_regex = (RE *)0x6769537869736f70;
  builtin_strncpy(regex,"nalHandler",0xb);
  unique0x10000295 = this;
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_001136ca;
  testing::internal::RE::RE((RE *)&gtest_dt,(char *)&gtest_regex);
  local_30 = (RE *)&gtest_dt;
  bVar2 = testing::internal::DeathTest::Create
                    ("RaiseSehException()",(RE *)&gtest_dt,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                     ,0x76,&local_c8);
  if (bVar2) {
    if (local_c8 != (DeathTest *)0x0) {
      testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr(&local_e0,local_c8);
      iVar3 = (*local_c8->_vptr_DeathTest[2])();
      pDVar1 = local_c8;
      if (iVar3 == 0) {
        extensions::ExitedOrKilled::ExitedOrKilled((ExitedOrKilled *)&gtest_sentinel,3,0xf);
        iVar3 = (*local_c8->_vptr_DeathTest[3])();
        bVar2 = extensions::ExitedOrKilled::operator()((ExitedOrKilled *)&gtest_sentinel,iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_0011365c;
        local_11c = 2;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_c8);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            RaiseSehException();
          }
          (*local_c8->_vptr_DeathTest[5])(local_c8,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_0011365c:
        local_11c = 0;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&local_e0);
      if (local_11c != 0) goto LAB_00113698;
    }
    local_11c = 0;
  }
  else {
    local_11c = 2;
  }
LAB_00113698:
  testing::internal::RE::~RE((RE *)&gtest_dt);
  if (local_11c == 0) {
    return;
  }
LAB_001136ca:
  testing::Message::Message(&local_128);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x76,message);
  testing::internal::AssertHelper::operator=(&local_130,&local_128);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  testing::Message::~Message(&local_128);
  return;
}

Assistant:

TEST_F (RecoveryTest, RaiseExceptionTest) {
#ifdef _WIN32
    const char regex[] = "Chillout SehHandler";
#else
    const char regex[] = "posixSignalHandler";
#endif
    ASSERT_EXIT(RaiseSehException(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGTERM), regex);
}